

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portfwd.c
# Opt level: O2

_Bool portfwdmgr_unlisten(PortFwdManager *mgr,char *host,int port)

{
  PortFwdRecord *pfr;
  undefined1 auStack_68 [4];
  undefined4 local_64;
  int local_60;
  int local_5c;
  char *local_58;
  char *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined4 local_30;
  undefined8 local_28;
  
  local_64 = 0x4c;
  local_48 = 0;
  uStack_40 = 0;
  local_28 = 0;
  local_38 = 0;
  local_30 = 0;
  local_60 = port;
  local_5c = port;
  local_58 = host;
  local_50 = host;
  pfr = (PortFwdRecord *)del234(mgr->forwardings,auStack_68);
  if (pfr != (PortFwdRecord *)0x0) {
    logeventf(mgr->cl->logctx,"Closing listening port %s:%d",host,(ulong)(uint)port);
    pfr_free(pfr);
  }
  return pfr != (PortFwdRecord *)0x0;
}

Assistant:

bool portfwdmgr_unlisten(PortFwdManager *mgr, const char *host, int port)
{
    PortFwdRecord pfr_key;

    pfr_key.type = 'L';
    /* Safe to cast the const away here, because it will only be used
     * by pfr_cmp, which won't write to the string */
    pfr_key.saddr = pfr_key.daddr = (char *)host;
    pfr_key.sserv = pfr_key.dserv = NULL;
    pfr_key.sport = pfr_key.dport = port;
    pfr_key.local = NULL;
    pfr_key.remote = NULL;
    pfr_key.addressfamily = ADDRTYPE_UNSPEC;

    PortFwdRecord *pfr = del234(mgr->forwardings, &pfr_key);

    if (!pfr)
        return false;

    logeventf(mgr->cl->logctx, "Closing listening port %s:%d", host, port);

    pfr_free(pfr);
    return true;
}